

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ScopedElement * __thiscall
Catch::XmlWriter::ScopedElement::operator=(ScopedElement *this,ScopedElement *other)

{
  if (this->m_writer != (XmlWriter *)0x0) {
    endElement(this->m_writer);
  }
  this->m_writer = other->m_writer;
  other->m_writer = (XmlWriter *)0x0;
  return this;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::operator=( ScopedElement&& other ) noexcept {
        if ( m_writer ) {
            m_writer->endElement();
        }
        m_writer = other.m_writer;
        other.m_writer = nullptr;
        return *this;
    }